

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddSymm.c
# Opt level: O2

Extra_SymmInfo_t * Extra_SymmPairsCreateFromZdd(DdManager *dd,DdNode *zPairs,DdNode *bSupp)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Extra_SymmInfo_t *pEVar5;
  void *__ptr;
  DdNode *n;
  DdNode *pDVar6;
  long lVar7;
  
  iVar4 = Extra_bddSuppSize(dd,bSupp);
  pEVar5 = Extra_SymmPairsAllocate(iVar4);
  iVar4 = dd->size;
  __ptr = calloc(1,(long)iVar4 << 2);
  pEVar5->nVarsMax = iVar4;
  pEVar5->nNodes = 0;
  pDVar6 = dd->one;
  lVar7 = 0;
  for (; bSupp != pDVar6; bSupp = (bSupp->type).kids.T) {
    uVar1 = bSupp->index;
    pEVar5->pVars[lVar7] = uVar1;
    *(int *)((long)__ptr + (ulong)uVar1 * 4) = (int)lVar7;
    lVar7 = lVar7 + 1;
  }
  Cudd_Ref(zPairs);
  while( true ) {
    if (zPairs == dd->zero) {
      Cudd_RecursiveDerefZdd(dd,zPairs);
      free(__ptr);
      return pEVar5;
    }
    n = Extra_zddSelectOneSubset(dd,zPairs);
    Cudd_Ref(n);
    pDVar6 = (n->type).kids.T;
    if ((pDVar6->type).kids.T != dd->one) break;
    iVar4 = *(int *)((long)__ptr + (ulong)(n->index >> 1) * 4);
    iVar2 = *(int *)((long)__ptr + (ulong)(pDVar6->index >> 1) * 4);
    iVar3 = iVar2;
    if (iVar4 < iVar2) {
      iVar3 = iVar4;
    }
    if (iVar2 < iVar4) {
      iVar2 = iVar4;
    }
    pEVar5->pSymms[iVar3][iVar2] = '\x01';
    pEVar5->nSymms = pEVar5->nSymms + 1;
    pDVar6 = Cudd_zddDiff(dd,zPairs,n);
    Cudd_Ref(pDVar6);
    Cudd_RecursiveDerefZdd(dd,zPairs);
    Cudd_RecursiveDerefZdd(dd,n);
    zPairs = pDVar6;
  }
  __assert_fail("cuddT( cuddT(zCube) ) == z1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddSymm.c"
                ,0x145,
                "Extra_SymmInfo_t *Extra_SymmPairsCreateFromZdd(DdManager *, DdNode *, DdNode *)");
}

Assistant:

Extra_SymmInfo_t * Extra_SymmPairsCreateFromZdd( DdManager * dd, DdNode * zPairs, DdNode * bSupp )
{
    int i;
    int nSuppSize;
    Extra_SymmInfo_t * p;
    int * pMapVars2Nums;
    DdNode * bTemp;
    DdNode * zSet, * zCube, * zTemp;
    int iVar1, iVar2;

    nSuppSize = Extra_bddSuppSize( dd, bSupp );

    // allocate and clean the storage for symmetry info
    p = Extra_SymmPairsAllocate( nSuppSize );

    // allocate the storage for the temporary map
    pMapVars2Nums = ABC_ALLOC( int, dd->size );
    memset( pMapVars2Nums, 0, dd->size * sizeof(int) );

    // assign the variables
    p->nVarsMax = dd->size;
//  p->nNodes   = Cudd_DagSize( zPairs );
    p->nNodes   = 0;
    for ( i = 0, bTemp = bSupp; bTemp != b1; bTemp = cuddT(bTemp), i++ )
    {
        p->pVars[i] = bTemp->index;
        pMapVars2Nums[bTemp->index] = i;
    }

    // write the symmetry info into the structure
    zSet = zPairs;   Cudd_Ref( zSet );
    while ( zSet != z0 )
    {
        // get the next cube
        zCube  = Extra_zddSelectOneSubset( dd, zSet );    Cudd_Ref( zCube );

        // add these two variables to the data structure
        assert( cuddT( cuddT(zCube) ) == z1 );
        iVar1 = zCube->index/2;
        iVar2 = cuddT(zCube)->index/2;
        if ( pMapVars2Nums[iVar1] < pMapVars2Nums[iVar2] )
            p->pSymms[ pMapVars2Nums[iVar1] ][ pMapVars2Nums[iVar2] ] = 1;
        else
            p->pSymms[ pMapVars2Nums[iVar2] ][ pMapVars2Nums[iVar1] ] = 1;
        // count the symmetric pairs
        p->nSymms ++;

        // update the cuver and deref the cube
        zSet = Cudd_zddDiff( dd, zTemp = zSet, zCube );     Cudd_Ref( zSet );
        Cudd_RecursiveDerefZdd( dd, zTemp );
        Cudd_RecursiveDerefZdd( dd, zCube );

    } // for each cube 
    Cudd_RecursiveDerefZdd( dd, zSet );

    ABC_FREE( pMapVars2Nums );
    return p;

}